

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall
Catch::ListeningReporter::sectionEnded(ListeningReporter *this,SectionStats *sectionStats)

{
  pointer puVar1;
  IStreamingReporter *pIVar2;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *listener;
  pointer puVar3;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_listeners).
                super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pIVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    (*pIVar2->_vptr_IStreamingReporter[0xb])(pIVar2,sectionStats);
  }
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IStreamingReporter[0xb])(pIVar2,sectionStats);
  return;
}

Assistant:

void ListeningReporter::sectionEnded( SectionStats const& sectionStats ) {
        for ( auto const& listener : m_listeners ) {
            listener->sectionEnded( sectionStats );
        }
        m_reporter->sectionEnded( sectionStats );
    }